

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

SegmentIdentificationHeader *
lrit::getHeader<lrit::SegmentIdentificationHeader>
          (SegmentIdentificationHeader *__return_storage_ptr__,Buffer *b,int pos)

{
  pointer puVar1;
  HeaderReader<lrit::SegmentIdentificationHeader> local_30;
  
  local_30.b_ = b;
  local_30.p_ = pos;
  HeaderReader<lrit::SegmentIdentificationHeader>::getHeader(&local_30);
  puVar1 = ((local_30.b_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __return_storage_ptr__->imageIdentifier =
       *(ushort *)(puVar1 + local_30.p_) << 8 | *(ushort *)(puVar1 + local_30.p_) >> 8;
  __return_storage_ptr__->segmentNumber =
       *(ushort *)(puVar1 + (local_30.p_ + 2)) << 8 | *(ushort *)(puVar1 + (local_30.p_ + 2)) >> 8;
  __return_storage_ptr__->segmentStartColumn =
       *(ushort *)(puVar1 + (local_30.p_ + 4)) << 8 | *(ushort *)(puVar1 + (local_30.p_ + 4)) >> 8;
  __return_storage_ptr__->segmentStartLine =
       *(ushort *)(puVar1 + (local_30.p_ + 6)) << 8 | *(ushort *)(puVar1 + (local_30.p_ + 6)) >> 8;
  __return_storage_ptr__->maxSegment =
       *(ushort *)(puVar1 + (local_30.p_ + 8)) << 8 | *(ushort *)(puVar1 + (local_30.p_ + 8)) >> 8;
  __return_storage_ptr__->maxColumn =
       *(ushort *)(puVar1 + (local_30.p_ + 10)) << 8 | *(ushort *)(puVar1 + (local_30.p_ + 10)) >> 8
  ;
  __return_storage_ptr__->maxLine =
       *(ushort *)(puVar1 + (local_30.p_ + 0xc)) << 8 |
       *(ushort *)(puVar1 + (local_30.p_ + 0xc)) >> 8;
  return __return_storage_ptr__;
}

Assistant:

SegmentIdentificationHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<SegmentIdentificationHeader>(b, pos);
  auto h = r.getHeader();
  r.read(&h.imageIdentifier);
  r.read(&h.segmentNumber);
  r.read(&h.segmentStartColumn);
  r.read(&h.segmentStartLine);
  r.read(&h.maxSegment);
  r.read(&h.maxColumn);
  r.read(&h.maxLine);
  return h;
}